

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t la_mktemp(archive_write_disk *a)

{
  int iVar1;
  int *piVar2;
  mode_t mode;
  wchar_t fd;
  wchar_t oerrno;
  archive_write_disk *a_local;
  
  (a->_tmpname_data).length = 0;
  archive_string_sprintf(&a->_tmpname_data,"%s.XXXXXX",a->name);
  a->tmpname = (a->_tmpname_data).s;
  a_local._4_4_ = __archive_mkstemp(a->tmpname);
  if (a_local._4_4_ == L'\xffffffff') {
    a_local._4_4_ = L'\xffffffff';
  }
  else {
    iVar1 = fchmod(a_local._4_4_,a->mode & 0x1ff & (a->user_umask ^ 0xffffffff));
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      close(a_local._4_4_);
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      a_local._4_4_ = L'\xffffffff';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
la_mktemp(struct archive_write_disk *a)
{
	int oerrno, fd;
	mode_t mode;

	archive_string_empty(&a->_tmpname_data);
	archive_string_sprintf(&a->_tmpname_data, "%s.XXXXXX", a->name);
	a->tmpname = a->_tmpname_data.s;

	fd = __archive_mkstemp(a->tmpname);
	if (fd == -1)
		return -1;

	mode = a->mode & 0777 & ~a->user_umask;
	if (fchmod(fd, mode) == -1) {
		oerrno = errno;
		close(fd);
		errno = oerrno;
		return -1;
	}
	return fd;
}